

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O2

bool __thiscall
cappuccino::lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::insert
          (lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,unsigned_long value,allow a)

{
  bool bVar1;
  unsigned_long local_30;
  
  local_30 = value;
  std::mutex::lock((mutex *)this);
  bVar1 = do_insert_update(this,key,&local_30,a);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar1;
}

Assistant:

auto insert(const key_type& key, value_type value, allow a = allow::insert_or_update) -> bool
    {
        std::lock_guard guard{m_lock};
        return do_insert_update(key, std::move(value), a);
    }